

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O2

void duckdb::GatherSetOpBinders
               (BoundQueryNode *node,Binder *binder,
               vector<std::reference_wrapper<duckdb::Binder>,_true> *binders)

{
  BoundSetOperationNode *pBVar1;
  type node_00;
  type binder_00;
  reference_wrapper<duckdb::Binder> local_20;
  
  while (node->type == SET_OPERATION_NODE) {
    pBVar1 = BoundQueryNode::Cast<duckdb::BoundSetOperationNode>(node);
    node_00 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator*(&pBVar1->left);
    binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar1->left_binder);
    GatherSetOpBinders(node_00,binder_00,binders);
    node = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator*(&pBVar1->right);
    binder = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar1->right_binder);
  }
  local_20._M_data = binder;
  ::std::
  vector<std::reference_wrapper<duckdb::Binder>,std::allocator<std::reference_wrapper<duckdb::Binder>>>
  ::emplace_back<std::reference_wrapper<duckdb::Binder>>
            ((vector<std::reference_wrapper<duckdb::Binder>,std::allocator<std::reference_wrapper<duckdb::Binder>>>
              *)binders,&local_20);
  return;
}

Assistant:

static void GatherSetOpBinders(BoundQueryNode &node, Binder &binder, vector<reference<Binder>> &binders) {
	if (node.type != QueryNodeType::SET_OPERATION_NODE) {
		binders.push_back(binder);
		return;
	}
	auto &setop_node = node.Cast<BoundSetOperationNode>();
	GatherSetOpBinders(*setop_node.left, *setop_node.left_binder, binders);
	GatherSetOpBinders(*setop_node.right, *setop_node.right_binder, binders);
}